

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O0

void UTF_fgets_test2(char *fname)

{
  int iVar1;
  char *pcVar2;
  char local_98 [8];
  char buf [128];
  FILE *fp;
  char *fname_local;
  
  buf._120_8_ = fopen(fname,"rb");
  if ((FILE *)buf._120_8_ == (FILE *)0x0) {
    UTF_test(0x7f,false);
  }
  else {
    pcVar2 = UTF_fgets<char>(local_98,10,(FILE *)buf._120_8_);
    UTF_test(0x83,pcVar2 == local_98);
    iVar1 = strcmp(local_98,"012345678");
    UTF_test(0x84,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(local_98,10,(FILE *)buf._120_8_);
    UTF_test(0x85,pcVar2 == local_98);
    iVar1 = strcmp(local_98,"901234567");
    UTF_test(0x86,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(local_98,10,(FILE *)buf._120_8_);
    UTF_test(0x87,pcVar2 == local_98);
    iVar1 = strcmp(local_98,"890123456");
    UTF_test(0x88,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(local_98,10,(FILE *)buf._120_8_);
    UTF_test(0x89,pcVar2 == local_98);
    iVar1 = strcmp(local_98,"78901234");
    UTF_test(0x8a,iVar1 == 0);
    pcVar2 = UTF_fgets<char>(local_98,10,(FILE *)buf._120_8_);
    UTF_test(0x8b,pcVar2 == (char *)0x0);
    fclose((FILE *)buf._120_8_);
  }
  return;
}

Assistant:

void UTF_fgets_test2(const char *fname)
{
    FILE *fp;
    char buf[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "012345678") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "901234567") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "890123456") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "78901234") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == NULL);

    fclose(fp);
}